

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O0

void __thiscall
sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::disconnect
          (BasicSignal<int_(),_std::lock_guard<std::mutex>_> *this,
          optional<std::shared_ptr<sigs::ConnectionBase>_> *conn)

{
  bool bVar1;
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
  *in_stack_ffffffffffffffb0;
  function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
  *in_stack_ffffffffffffffd8;
  BasicSignal<int_(),_std::lock_guard<std::mutex>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::shared_ptr<sigs::ConnectionBase>_> *)0x143391);
  if (bVar1) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffffb0,in_RDI);
    std::optional<std::shared_ptr<sigs::ConnectionBase>_>::optional
              ((optional<std::shared_ptr<sigs::ConnectionBase>_> *)in_stack_ffffffffffffffb0,
               (optional<std::shared_ptr<sigs::ConnectionBase>_> *)in_RDI);
    std::
    function<bool(__gnu_cxx::__normal_iterator<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry*,std::vector<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry,std::allocator<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry>>>)>
    ::
    function<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::disconnect(std::optional<std::shared_ptr<sigs::ConnectionBase>>const&)::_lambda(auto:1)_1_,void>
              (in_stack_ffffffffffffffb0,(anon_class_24_1_898a5c2a *)in_RDI);
    eraseEntries(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::
    function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
    ::~function((function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
                 *)0x1433e8);
    BasicSignal<int(),std::lock_guard<std::mutex>>::
    disconnect(std::optional<std::shared_ptr<sigs::ConnectionBase>>const&)::{lambda(auto:1)#1}::
    ~optional((anon_class_24_1_898a5c2a *)0x1433f2);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1433fc);
  }
  else {
    clear(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void disconnect(const std::optional<Connection> &conn = std::nullopt) noexcept
  {
    if (!conn) {
      clear();
      return;
    }

    Lock lock(entriesMutex);
    eraseEntries([conn](auto it) { return it->conn() == conn; });
  }